

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

void __thiscall Analyzer::removeNearestAssignmentsFoundAt(Analyzer *this,Node *node)

{
  bool bVar1;
  size_type sVar2;
  Node *pNVar3;
  reference pvVar4;
  Analyzer *in_RSI;
  Analyzer *in_RDI;
  size_t i_1;
  size_t i;
  ulong local_20;
  Node *pNVar5;
  Node *node_00;
  
  sVar2 = std::
          vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
          ::size(&nearest_assignments);
  if ((sVar2 != 0) && (in_RSI != (Analyzer *)0x0)) {
    pNVar5 = (Node *)0x0;
    while (node_00 = pNVar5,
          pNVar3 = (Node *)std::
                           vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                           ::size(&nearest_assignments), pNVar5 < pNVar3) {
      pvVar4 = std::
               vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
               ::operator[](&nearest_assignments,(size_type)node_00);
      if (pvVar4->first != (Node *)0x0) {
        std::
        vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
        ::operator[](&nearest_assignments,(size_type)node_00);
        bVar1 = isNodeEquals(in_RDI,(Node *)in_RSI,node_00);
        if (bVar1) {
          pvVar4 = std::
                   vector<std::pair<Node_*,_std::pair<Node_*,_bool>_>,_std::allocator<std::pair<Node_*,_std::pair<Node_*,_bool>_>_>_>
                   ::operator[](&nearest_assignments,(size_type)node_00);
          pvVar4->first = (Node *)0x0;
        }
      }
      pNVar5 = (Node *)((long)&(node_00->super_Poolable).ctx + 1);
    }
    for (local_20 = 0;
        sVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left), local_20 < sVar2; local_20 = local_20 + 1) {
      std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                ((vector<Node_*,_std::allocator<Node_*>_> *)
                 &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                 ,local_20);
      removeNearestAssignmentsFoundAt(in_RSI,node_00);
    }
  }
  return;
}

Assistant:

void removeNearestAssignmentsFoundAt(Node * node)
  {
    if (!nearest_assignments.size() || !node)
      return;

    for (size_t i = 0; i < nearest_assignments.size(); i++)
      if (nearest_assignments[i].first)
        if (isNodeEquals(nearest_assignments[i].first, node))
          nearest_assignments[i].first = nullptr;

    for (size_t i = 0; i < node->children.size(); i++)
      removeNearestAssignmentsFoundAt(node->children[i]);
  }